

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Relay.cpp
# Opt level: O0

void __thiscall RenX_RelayPlugin::RenX_OnRaw(RenX_RelayPlugin *this,Server *server,string_view line)

{
  basic_string_view<char,_std::char_traits<char>_> bVar1;
  string_view *__svt;
  undefined8 in_server_info;
  pointer server_00;
  bool bVar2;
  __type_conflict1 _Var3;
  size_type sVar4;
  reference pvVar5;
  reference ppuVar6;
  reference __rhs;
  pointer ppVar7;
  reference server_info_00;
  __sv_type _Var8;
  string_view sVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  RenX_RelayPlugin *local_158;
  char *pcStack_150;
  reference local_140;
  upstream_server_info *server_info;
  iterator __end1;
  iterator __begin1;
  vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>
  *__range1;
  size_type local_110;
  size_t index;
  string_view local_e0;
  string_view *local_d0;
  string_view *rcon_username;
  string line_sanitized;
  upstream_server_info *front_server_info;
  _Node_iterator_base<std::pair<RenX::Server_*const,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>,_false>
  local_80 [3];
  pointer local_68;
  _Node_iterator_base<std::pair<RenX::Server_*const,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>,_false>
  local_60;
  iterator server_info_map_itr;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined1 local_40 [8];
  container_type_conflict tokens;
  Server *server_local;
  RenX_RelayPlugin *this_local;
  string_view line_local;
  
  local_50._M_str = line._M_str;
  local_50._M_len = line._M_len;
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)server;
  this_local = (RenX_RelayPlugin *)local_50._M_len;
  line_local._M_len = (size_t)local_50._M_str;
  jessilib::split<std::vector,_std::basic_string_view<char,_std::char_traits<char>_>_>
            ((container_type_conflict *)local_40,&local_50,(value_type)RenX::DelimC);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_40);
  if (bVar2) {
    server_info_map_itr.
    super__Node_iterator_base<std::pair<RenX::Server_*const,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>,_false>
    ._M_cur._4_4_ = 1;
  }
  else {
    local_68 = tokens.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_60._M_cur =
         (__node_type *)
         std::
         unordered_map<RenX::Server_*,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>,_std::hash<RenX::Server_*>,_std::equal_to<RenX::Server_*>,_std::allocator<std::pair<RenX::Server_*const,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>_>_>
         ::find(&this->m_server_info_map,(key_type *)&local_68);
    local_80[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<RenX::Server_*,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>,_std::hash<RenX::Server_*>,_std::equal_to<RenX::Server_*>,_std::allocator<std::pair<RenX::Server_*const,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>_>_>
         ::end(&this->m_server_info_map);
    bVar2 = std::__detail::operator==(&local_60,local_80);
    if (bVar2) {
      server_info_map_itr.
      super__Node_iterator_base<std::pair<RenX::Server_*const,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>,_false>
      ._M_cur._4_4_ = 1;
    }
    else {
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_40);
      if (4 < sVar4) {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_40,0);
        bVar2 = std::operator==(pvVar5,"lRCON");
        if (bVar2) {
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_40,1);
          bVar2 = std::operator==(pvVar5,"Command;");
          if (bVar2) {
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_40,3);
            bVar2 = std::operator==(pvVar5,"executed:");
            if (bVar2) {
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_40,4);
              bVar2 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                                (pvVar5);
              if (!bVar2) {
                bVar1 = (basic_string_view<char,_std::char_traits<char>_>)
                        RenX::Server::getRCONUsername();
                pvVar5 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_40,2);
                _Var8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar5);
                bVar2 = std::operator==(bVar1,_Var8);
                if (((bVar2 ^ 0xffU) & 1) == 0) {
                  bVar2 = std::
                          deque<RenX_RelayPlugin::upstream_server_info_*,_std::allocator<RenX_RelayPlugin::upstream_server_info_*>_>
                          ::empty(&this->m_command_tracker);
                  if (bVar2) {
                    server_info_map_itr.
                    super__Node_iterator_base<std::pair<RenX::Server_*const,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>,_false>
                    ._M_cur._4_4_ = 1;
                  }
                  else {
                    ppuVar6 = std::
                              deque<RenX_RelayPlugin::upstream_server_info_*,_std::allocator<RenX_RelayPlugin::upstream_server_info_*>_>
                              ::front(&this->m_command_tracker);
                    line_sanitized.field_2._8_8_ = *ppuVar6;
                    if (((value_type)line_sanitized.field_2._8_8_ != (value_type)0x0) &&
                       ((((value_type)line_sanitized.field_2._8_8_)->m_processing_command & 1U) == 0
                       )) {
                      pvVar5 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)local_40,4);
                      __rhs = std::
                              deque<RenX_RelayPlugin::UpstreamCommand,_std::allocator<RenX_RelayPlugin::UpstreamCommand>_>
                              ::front((deque<RenX_RelayPlugin::UpstreamCommand,_std::allocator<RenX_RelayPlugin::UpstreamCommand>_>
                                       *)(line_sanitized.field_2._8_8_ + 0x48));
                      _Var3 = std::operator==(pvVar5,&__rhs->m_command);
                      if (((_Var3 ^ 0xffU) & 1) == 0) {
                        *(undefined1 *)(line_sanitized.field_2._8_8_ + 0x98) = 1;
                        std::__cxx11::string::string((string *)&rcon_username);
                        sVar9 = get_upstream_rcon_username
                                          (this,(upstream_server_info *)line_sanitized.field_2._8_8_
                                           ,(Server *)
                                            tokens.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        local_d0 = &local_e0;
                        local_e0 = sVar9;
                        bVar1 = (basic_string_view<char,_std::char_traits<char>_>)
                                RenX::Server::getRCONUsername();
                        bVar2 = std::operator==(sVar9,bVar1);
                        __svt = local_d0;
                        if (bVar2) {
                          std::__cxx11::string::operator=
                                    ((string *)&rcon_username,
                                     (basic_string_view<char,_std::char_traits<char>_> *)&this_local
                                    );
                        }
                        else {
                          pvVar5 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)local_40,2);
                          std::__cxx11::string::operator=((string *)pvVar5,__svt);
                          pvVar5 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 *)local_40,0);
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&rcon_username,pvVar5);
                          local_110 = 1;
                          while( true ) {
                            sVar4 = std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)local_40);
                            if (local_110 == sVar4) break;
                            std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&rcon_username,(value_type)RenX::DelimC);
                            pvVar5 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_40,local_110);
                            std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&rcon_username,pvVar5);
                            local_110 = local_110 + 1;
                          }
                        }
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                        operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&rcon_username,'\n');
                        in_server_info = line_sanitized.field_2._8_8_;
                        _Var8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                          ((string *)&rcon_username);
                        send_upstream(this,(upstream_server_info *)in_server_info,_Var8,
                                      (Server *)
                                      tokens.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        server_info_map_itr.
                        super__Node_iterator_base<std::pair<RenX::Server_*const,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>,_false>
                        ._M_cur._4_4_ = 1;
                        std::__cxx11::string::~string((string *)&rcon_username);
                        goto LAB_0018e7a4;
                      }
                    }
                    server_info_map_itr.
                    super__Node_iterator_base<std::pair<RenX::Server_*const,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>,_false>
                    ._M_cur._4_4_ = 1;
                  }
                  goto LAB_0018e7a4;
                }
                if (((this->m_default_settings).m_suppress_rcon_command_logs & 1U) != 0) {
                  server_info_map_itr.
                  super__Node_iterator_base<std::pair<RenX::Server_*const,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>,_false>
                  ._M_cur._4_4_ = 1;
                  goto LAB_0018e7a4;
                }
              }
            }
          }
        }
      }
      ppVar7 = std::__detail::
               _Node_iterator<std::pair<RenX::Server_*const,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>,_false,_false>
               ::operator->((_Node_iterator<std::pair<RenX::Server_*const,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>,_false,_false>
                             *)&local_60);
      __end1 = std::
               vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>
               ::begin(&ppVar7->second);
      server_info = (upstream_server_info *)
                    std::
                    vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>
                    ::end(&ppVar7->second);
      while( true ) {
        bVar2 = __gnu_cxx::
                operator==<RenX_RelayPlugin::upstream_server_info_*,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>
                          (&__end1,(__normal_iterator<RenX_RelayPlugin::upstream_server_info_*,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>
                                    *)&server_info);
        if (((bVar2 ^ 0xffU) & 1) == 0) break;
        server_info_00 =
             __gnu_cxx::
             __normal_iterator<RenX_RelayPlugin::upstream_server_info_*,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>
             ::operator*(&__end1);
        server_00 = tokens.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_158 = this_local;
        pcStack_150 = (char *)line_local._M_len;
        local_140 = server_info_00;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_170,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_40);
        sVar9._M_str = pcStack_150;
        sVar9._M_len = (size_t)local_158;
        process_renx_message(this,(Server *)server_00,server_info_00,sVar9,&local_170);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_170);
        __gnu_cxx::
        __normal_iterator<RenX_RelayPlugin::upstream_server_info_*,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>
        ::operator++(&__end1);
      }
      server_info_map_itr.
      super__Node_iterator_base<std::pair<RenX::Server_*const,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>,_false>
      ._M_cur._4_4_ = 0;
    }
  }
LAB_0018e7a4:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40);
  return;
}

Assistant:

void RenX_RelayPlugin::RenX_OnRaw(RenX::Server &server, std::string_view line) {
	// Not parsing any escape sequences, so data gets sent upstream exactly as it's received here. Copy tokens where needed to process escape sequences.
	auto tokens = jessilib::split(std::string_view{line}, RenX::DelimC);

	// Ensure valid message received
	if (tokens.empty()) {
		return;
	}

	// Check that we already have a session for this server
	auto server_info_map_itr = m_server_info_map.find(&server);
	if (server_info_map_itr == m_server_info_map.end()) {
		// early out: server not yet registered (i.e: finished auth)
		return;
	}

	// Suppress unassociated command execution logs from going upstream
	if (tokens.size() >= 5
		&& tokens[0] == "lRCON"
		&& tokens[1] == "Command;"
		&& tokens[3] == "executed:"
		&& !tokens[4].empty()) {
		if (tokens[2] != server.getRCONUsername()) {
			if (m_default_settings.m_suppress_rcon_command_logs) { // TODO: move away from per-stream settings
				// Suppress RCON command logs from other RCON users
				return;
			}
		}
		else if (m_command_tracker.empty()) {
			// This command response wasn't requested by any current upstream connections; suppress it
			return;
		}
		else {
			upstream_server_info* front_server_info = m_command_tracker.front();
			if (front_server_info == nullptr
				|| front_server_info->m_processing_command
				|| tokens[4] != front_server_info->m_response_queue.front().m_command) {
				// This command response wasn't requested by any current upstream connections; suppress it
				return;
			}

			// This is the next command we're been waiting on; mark processing command and let this go through
			front_server_info->m_processing_command = true;

			// This is a command response for an upstream command; this is only relevant to one server: that server
			// Always echo the command back exactly as it was sent
			std::string line_sanitized;
			const auto& rcon_username = get_upstream_rcon_username(*front_server_info, server);
			if (rcon_username == server.getRCONUsername()) {
				// No need to recombine tokens
				line_sanitized = line;
			}
			else {
				// TODO: add assignment operators to Jupiter::string crap
				tokens[2] = rcon_username;

				// Construct line to send and send it
				line_sanitized = tokens[0];
				for (size_t index = 1; index != tokens.size(); ++index) {
					line_sanitized += RenX::DelimC;
					line_sanitized += tokens[index];
				}
			}
			line_sanitized += '\n';

			send_upstream(*front_server_info, line_sanitized, server);
			return;
		}
	}

	for (auto& server_info : server_info_map_itr->second) {
		// Pass tokens by copy so sanitizations can differ per-upstream
		// TODO: optimize to only copy when needed
		// TODO: only generate sanitized message once if all upstreams are configured the same (i.e: all match default)
		process_renx_message(server, server_info, line, tokens);
	}
}